

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
pstore::small_vector<int,_3UL>::small_vector
          (small_vector<int,_3UL> *this,small_vector<int,_3UL> *rhs)

{
  int *__value;
  ulong uVar1;
  back_insert_iterator<pstore::small_vector<int,_3UL>_> local_30;
  
  (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->elements_ = 0;
  (this->small_buffer_)._M_elems[0] = 0;
  (this->small_buffer_)._M_elems[1] = 0;
  (this->small_buffer_)._M_elems[2] = 0;
  this->buffer_ = (this->small_buffer_)._M_elems;
  uVar1 = rhs->elements_;
  if (3 < uVar1) {
    std::vector<int,_std::allocator<int>_>::reserve(&this->big_buffer_,uVar1);
    uVar1 = rhs->elements_;
  }
  __value = rhs->buffer_;
  if (0 < (long)uVar1) {
    uVar1 = uVar1 + 1;
    local_30.container = this;
    do {
      std::back_insert_iterator<pstore::small_vector<int,_3UL>_>::operator=(&local_30,__value);
      __value = __value + 1;
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
  }
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (small_vector const & rhs)
            : small_vector () {
        this->reserve (rhs.size ());
        std::copy (std::begin (rhs), std::end (rhs), std::back_inserter (*this));
    }